

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_http_file_server.c
# Opt level: O0

void uo_http_file_server_destroy(uo_http_file_server *http_file_server)

{
  uo_http_file_cache_entry *cache_entry_00;
  uo_strkvp_linklist *link;
  uo_strkvp_linklist *puVar1;
  uo_http_file_cache_entry *cache_entry;
  uo_strkvp_linklist *strkvp_linklist;
  uo_strkvp_linklist *head;
  uo_http_file_server *http_file_server_local;
  
  link = uo_strhashtbl_list(&http_file_server->cache);
  while( true ) {
    puVar1 = uo_strkvp_linklist_next(link);
    if (link == puVar1) break;
    puVar1 = uo_strkvp_linklist_next(link);
    uo__linklist_unlink(&puVar1->link);
    cache_entry_00 = (uo_http_file_cache_entry *)(puVar1->item).value;
    pthread_mutex_lock((pthread_mutex_t *)&cache_entry_00->mtx);
    uo_http_file_cache_entry_destroy(cache_entry_00);
  }
  uo_strhashtbl_destroy_at(&http_file_server->cache);
  pthread_mutex_destroy((pthread_mutex_t *)http_file_server->mtx);
  free(http_file_server->mtx);
  free(http_file_server->dirname);
  free(http_file_server);
  return;
}

Assistant:

void uo_http_file_server_destroy(
    uo_http_file_server *http_file_server)
{
    uo_strkvp_linklist *head = uo_strhashtbl_list(&http_file_server->cache);

    while (head != uo_strkvp_linklist_next(head)) 
    {
        uo_strkvp_linklist *strkvp_linklist = uo_strkvp_linklist_next(head);
        uo_linklist_unlink(&strkvp_linklist->link);
        uo_http_file_cache_entry *cache_entry = strkvp_linklist->item.value;
        pthread_mutex_lock(&cache_entry->mtx);
        uo_http_file_cache_entry_destroy(cache_entry);
    }

    uo_strhashtbl_destroy_at(&http_file_server->cache);
    pthread_mutex_destroy(http_file_server->mtx);
    free(http_file_server->mtx);
    free((void *)http_file_server->dirname);
    free(http_file_server);
}